

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_casts.cpp
# Opt level: O1

bool duckdb::ListToVarcharCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  VectorType VVar1;
  PhysicalType PVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  unsigned_long *puVar5;
  Vector *pVVar6;
  code *pcVar7;
  idx_t iVar8;
  void *pvVar9;
  Vector *vector;
  long lVar10;
  ulong uVar11;
  code *pcVar12;
  long lVar13;
  anon_union_16_2_67f50693_for_value *paVar14;
  char *pcVar15;
  uint *puVar16;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  ulong uVar17;
  idx_t len;
  data_ptr_t pdVar18;
  ulong idx;
  Vector *pVVar19;
  long lVar20;
  pointer __old_p;
  void *pvVar21;
  ulong uVar22;
  char *pcVar23;
  pointer ptr;
  bool bVar24;
  undefined1 auVar25 [16];
  anon_struct_16_3_d7536bce_for_pointer aVar26;
  Vector varchar_list;
  ulong local_108;
  LogicalType local_c8;
  LogicalType local_b0;
  Vector local_98;
  
  VVar1 = source->vector_type;
  LogicalType::LogicalType(&local_b0,VARCHAR);
  LogicalType::LIST(&local_c8,&local_b0);
  Vector::Vector(&local_98,&local_c8,count);
  LogicalType::~LogicalType(&local_c8);
  LogicalType::~LogicalType(&local_b0);
  ListCast::ListToListCast(source,&local_98,count,parameters);
  pVVar6 = ListVector::GetEntry(source);
  PVar2 = (pVVar6->type).physical_type_;
  pcVar12 = VectorCastHelpers::CalculateEscapedStringLength<false>;
  bVar24 = (PVar2 < (STRUCT|UINT32) & (byte)(0x21800000 >> (PVar2 & (STRUCT|INT32)))) != 0;
  if (bVar24) {
    pcVar12 = VectorCastHelpers::CalculateStringLength;
  }
  pcVar7 = VectorCastHelpers::WriteEscapedString<false>;
  if (bVar24) {
    pcVar7 = VectorCastHelpers::WriteString;
  }
  Vector::Flatten(&local_98,count);
  pVVar6 = ListVector::GetEntry(&local_98);
  FlatVector::VerifyFlatVector(&local_98);
  iVar8 = ListVector::GetListSize(&local_98);
  Vector::Flatten(pVVar6,iVar8);
  pdVar3 = pVVar6->data;
  FlatVector::VerifyFlatVector(pVVar6);
  if (count == 0) {
    pvVar21 = (void *)0x0;
  }
  else {
    pdVar4 = result->data;
    idx = 0;
    pvVar21 = (void *)0x0;
    do {
      if ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[idx >> 6] >>
           (idx & 0x3f) & 1) != 0)) {
        lVar13 = idx * 0x10;
        iVar8 = *(idx_t *)(local_98.data + lVar13);
        uVar11 = *(ulong *)(local_98.data + lVar13 + 8);
        len = iVar8;
        pvVar9 = pvVar21;
        if ((local_108 < uVar11 || pvVar21 == (void *)0x0) &&
           (pvVar9 = operator_new__(uVar11), len = extraout_RDX, local_108 = uVar11,
           pvVar21 != (void *)0x0)) {
          operator_delete__(pvVar21);
          len = extraout_RDX_00;
        }
        pvVar21 = pvVar9;
        if (uVar11 == 0) {
          vector = (Vector *)0x2;
        }
        else {
          pdVar18 = pdVar3 + iVar8 * 0x10;
          vector = (Vector *)0x2;
          uVar22 = 0;
          do {
            pVVar19 = (Vector *)&vector->field_0x2;
            if (uVar22 == 0) {
              pVVar19 = vector;
            }
            puVar5 = (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar5 == (unsigned_long *)0x0) ||
               (uVar17 = iVar8 + uVar22 >> 6, (puVar5[uVar17] >> (iVar8 + uVar22 & 0x3f) & 1) != 0))
            {
              auVar25 = (*pcVar12)(pdVar18,(long)pvVar21 + uVar22);
            }
            else {
              auVar25._8_8_ = uVar17;
              auVar25._0_8_ = 4;
            }
            len = auVar25._8_8_;
            vector = (Vector *)(&pVVar19->vector_type + auVar25._0_8_);
            uVar22 = uVar22 + 1;
            pdVar18 = pdVar18 + 0x10;
          } while (uVar11 != uVar22);
        }
        aVar26 = (anon_struct_16_3_d7536bce_for_pointer)
                 StringVector::EmptyString((StringVector *)result,vector,len);
        paVar14 = (anon_union_16_2_67f50693_for_value *)(pdVar4 + lVar13);
        pcVar15 = (paVar14->pointer).prefix;
        paVar14->pointer = aVar26;
        pcVar23 = aVar26.ptr;
        if (aVar26.length < 0xd) {
          pcVar23 = pcVar15;
        }
        *pcVar23 = '[';
        if (uVar11 == 0) {
          lVar20 = 1;
        }
        else {
          pdVar18 = pdVar3 + iVar8 * 0x10;
          lVar20 = 1;
          uVar22 = 0;
          do {
            if (uVar22 != 0) {
              (pcVar23 + lVar20)[0] = ',';
              (pcVar23 + lVar20)[1] = ' ';
              lVar20 = lVar20 + 2;
            }
            puVar5 = (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar5 == (unsigned_long *)0x0) ||
               ((puVar5[iVar8 + uVar22 >> 6] >> (iVar8 + uVar22 & 0x3f) & 1) != 0)) {
              lVar10 = (*pcVar7)(pcVar23 + lVar20,pdVar18,*(undefined1 *)((long)pvVar21 + uVar22));
            }
            else {
              builtin_strncpy(pcVar23 + lVar20,"NULL",4);
              lVar10 = 4;
            }
            lVar20 = lVar10 + lVar20;
            uVar22 = uVar22 + 1;
            pdVar18 = pdVar18 + 0x10;
          } while (uVar11 != uVar22);
        }
        puVar16 = (uint *)(pdVar4 + lVar13);
        pcVar23[lVar20] = ']';
        uVar11 = (ulong)*puVar16;
        if (uVar11 < 0xd) {
          switchD_01306cb1::default(pcVar15 + uVar11,0,0xc - uVar11);
        }
        else {
          puVar16[1] = **(uint **)(puVar16 + 2);
        }
      }
      else {
        FlatVector::SetNull(result,idx,true);
      }
      idx = idx + 1;
    } while (idx != count);
  }
  if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  if (pvVar21 != (void *)0x0) {
    operator_delete__(pvVar21);
  }
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  return true;
}

Assistant:

static bool ListToVarcharCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto constant = source.GetVectorType() == VectorType::CONSTANT_VECTOR;
	// first cast the child vector to varchar
	Vector varchar_list(LogicalType::LIST(LogicalType::VARCHAR), count);
	ListCast::ListToListCast(source, varchar_list, count, parameters);

	auto &child_vec = ListVector::GetEntry(source);
	auto child_is_nested = child_vec.GetType().IsNested();
	auto string_length_func = child_is_nested ? VectorCastHelpers::CalculateStringLength
	                                          : VectorCastHelpers::CalculateEscapedStringLength<false>;
	auto write_string_func =
	    child_is_nested ? VectorCastHelpers::WriteString : VectorCastHelpers::WriteEscapedString<false>;

	// now construct the actual varchar vector
	varchar_list.Flatten(count);
	auto &child = ListVector::GetEntry(varchar_list);
	auto list_data = FlatVector::GetData<list_entry_t>(varchar_list);
	auto &validity = FlatVector::Validity(varchar_list);

	child.Flatten(ListVector::GetListSize(varchar_list));
	auto child_data = FlatVector::GetData<string_t>(child);
	auto &child_validity = FlatVector::Validity(child);

	auto result_data = FlatVector::GetData<string_t>(result);
	static constexpr const idx_t SEP_LENGTH = 2;
	static constexpr const idx_t NULL_LENGTH = 4;
	unsafe_unique_array<bool> needs_quotes;
	idx_t needs_quotes_length;

	for (idx_t i = 0; i < count; i++) {
		if (!validity.RowIsValid(i)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}
		auto list = list_data[i];
		// figure out how long the result needs to be
		idx_t list_length = 2; // "[" and "]"
		if (!needs_quotes || list.length > needs_quotes_length) {
			needs_quotes = make_unsafe_uniq_array_uninitialized<bool>(list.length);
			needs_quotes_length = list.length;
		}
		for (idx_t list_idx = 0; list_idx < list.length; list_idx++) {
			auto idx = list.offset + list_idx;
			if (list_idx > 0) {
				list_length += SEP_LENGTH; // ", "
			}
			// string length, or "NULL"
			if (child_validity.RowIsValid(idx)) {
				list_length += string_length_func(child_data[idx], needs_quotes[list_idx]);
			} else {
				list_length += NULL_LENGTH;
			}
		}
		result_data[i] = StringVector::EmptyString(result, list_length);
		auto dataptr = result_data[i].GetDataWriteable();
		idx_t offset = 0;
		dataptr[offset++] = '[';
		for (idx_t list_idx = 0; list_idx < list.length; list_idx++) {
			auto idx = list.offset + list_idx;
			if (list_idx > 0) {
				memcpy(dataptr + offset, ", ", SEP_LENGTH);
				offset += SEP_LENGTH;
			}
			if (child_validity.RowIsValid(idx)) {
				offset += write_string_func(dataptr + offset, child_data[idx], needs_quotes[list_idx]);
			} else {
				memcpy(dataptr + offset, "NULL", NULL_LENGTH);
				offset += NULL_LENGTH;
			}
		}
		dataptr[offset] = ']';
		result_data[i].Finalize();
	}

	if (constant) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	return true;
}